

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

bool __thiscall AggressiveBotStrategy::canAttack(AggressiveBotStrategy *this)

{
  byte bVar1;
  Country *pCVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar6;
  reference ppCVar7;
  bool local_109;
  int local_dc;
  Country *local_d8;
  Country *neighbour_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range2_1;
  Country *neighbour;
  iterator __end5;
  iterator __begin5;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range5;
  int local_8c;
  _Self local_88;
  Country *local_80;
  Country *country;
  iterator __end2;
  iterator __begin2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range2;
  set<int,_std::less<int>,_std::allocator<int>_> checkedCountries;
  Country *pCStack_18;
  bool canAttack;
  Country *biggest;
  AggressiveBotStrategy *this_local;
  
  pCStack_18 = (Country *)0x0;
  checkedCountries._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  memset(&__range2,0,0x30);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
  while (((checkedCountries._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ ^ 0xff) & 1) != 0
        ) {
    pvVar6 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
    __end2 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar6);
    country = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar6);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                       *)&country), bVar3) {
      ppCVar7 = __gnu_cxx::
                __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                ::operator*(&__end2);
      local_80 = *ppCVar7;
      pCVar2 = local_80;
      if (pCStack_18 != (Country *)0x0) {
        iVar4 = Map::Country::getNumberOfTroops(pCStack_18);
        iVar5 = Map::Country::getNumberOfTroops(local_80);
        local_109 = true;
        if (iVar5 <= iVar4) {
          local_8c = Map::Country::getCountryId(pCStack_18);
          local_88._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::find
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2,&local_8c);
          __range5 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)
                     std::set<int,_std::less<int>,_std::allocator<int>_>::end
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
          local_109 = std::operator!=(&local_88,(_Self *)&__range5);
        }
        pCVar2 = pCStack_18;
        if (local_109 != false) {
          pvVar6 = Map::Country::getAdjCountries(local_80);
          __end5 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar6);
          neighbour = (Country *)
                      std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar6);
          while (bVar3 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                             *)&neighbour), pCVar2 = pCStack_18, bVar3) {
            ppCVar7 = __gnu_cxx::
                      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                      ::operator*(&__end5);
            iVar4 = Map::Country::getPlayerOwnerID(*ppCVar7);
            iVar5 = Map::Country::getPlayerOwnerID(local_80);
            if (iVar4 != iVar5) {
              pCStack_18 = local_80;
            }
            __gnu_cxx::
            __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
            ::operator++(&__end5);
          }
        }
      }
      pCStack_18 = pCVar2;
      __gnu_cxx::
      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
      ::operator++(&__end2);
    }
    pvVar6 = Map::Country::getAdjCountries(pCStack_18);
    __end2_1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar6);
    neighbour_1 = (Country *)
                  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar6);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                               *)&neighbour_1), bVar3) {
      ppCVar7 = __gnu_cxx::
                __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                ::operator*(&__end2_1);
      local_d8 = *ppCVar7;
      iVar4 = Map::Country::getPlayerOwnerID(local_d8);
      iVar5 = Map::Country::getPlayerOwnerID(pCStack_18);
      if (iVar4 != iVar5) {
        checkedCountries._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
      }
      __gnu_cxx::
      __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
      ::operator++(&__end2_1);
    }
    if ((checkedCountries._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
      local_dc = Map::Country::getCountryId(pCStack_18);
      std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2,&local_dc);
    }
  }
  if ((this->super_PlayerStrategy).from != (Country *)0x0) {
    iVar4 = Map::Country::getCountryId(pCStack_18);
    iVar5 = Map::Country::getCountryId((this->super_PlayerStrategy).from);
    if (iVar4 != iVar5) {
      checkedCountries._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    }
  }
  bVar1 = checkedCountries._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_;
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
  return (bool)(bVar1 & 1);
}

Assistant:

bool AggressiveBotStrategy::canAttack() {
    Map::Country* biggest = nullptr;
    bool canAttack = false;
    std::set<int> checkedCountries = std::set<int>();

    while(!canAttack) {
        for (auto* country : *player->getOwnedCountries()) {
            if (biggest == nullptr) {
                biggest = country;
            } else if (biggest->getNumberOfTroops() < country->getNumberOfTroops() ||
                       checkedCountries.find(biggest->getCountryId()) != checkedCountries.end()) {
                for (auto* neighbour : *country->getAdjCountries()) {
                    if (neighbour->getPlayerOwnerID() != country->getPlayerOwnerID()) {
                        biggest = country;
                    }
                }
            }
        }

        for (auto* neighbour: *biggest->getAdjCountries()) {
            if (neighbour->getPlayerOwnerID() != biggest->getPlayerOwnerID()) {
                canAttack = true;
            }
        }
        if (!canAttack) {
            checkedCountries.insert(biggest->getCountryId());
        }
    }

    if (from != nullptr && biggest->getCountryId() != from->getCountryId()) {
        canAttack = false;
    }
    return canAttack;
}